

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O1

GLvoid __thiscall
glcts::anon_unknown_0::GatherBase::CreateTexture2DRg(GatherBase *this,bool base_level)

{
  CallLogWrapper *this_00;
  int i;
  long lVar1;
  uint uVar2;
  uint level;
  undefined7 in_register_00000031;
  int level_00;
  int iVar3;
  bool bVar4;
  allocator_type local_5d;
  uint local_5c;
  Vec2 data [4];
  value_type local_38;
  
  local_5c = (uint)CONCAT71(in_register_00000031,base_level);
  iVar3 = local_5c * 0x20;
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->tex);
  level_00 = 0;
  uVar2 = iVar3 + 0x20;
  do {
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,level_00,0x8230,uVar2,uVar2,0,0x8227,0x1406,(void *)0x0);
    lVar1 = 0;
    do {
      local_38.m_data[lVar1] = 1.0;
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)data,
               (ulong)(uVar2 * uVar2),&local_38,&local_5d);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,level_00,0x8230,uVar2,uVar2,0,0x8227,0x1406,(void *)data[0].m_data);
    if (data[0].m_data != (float  [2])0x0) {
      operator_delete((void *)data[0].m_data,(long)data[2].m_data - (long)data[0].m_data);
    }
    level_00 = level_00 + 1;
    bVar4 = 1 < uVar2;
    uVar2 = uVar2 >> 1;
  } while (bVar4);
  data[0].m_data[0] = 0.75;
  data[0].m_data[1] = 0.8125;
  data[1].m_data[0] = 0.5;
  data[1].m_data[1] = 0.5625;
  data[2].m_data[0] = 0.0;
  data[2].m_data[1] = 0.0625;
  data[3].m_data[0] = 0.25;
  data[3].m_data[1] = 0.3125;
  uVar2 = local_5c & 0xff;
  level = local_5c & 0xff;
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,0xde1,uVar2,0x16,0x19,2,2,0x8227,0x1406,
             (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)data);
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,0xde1,level,0x10,10,1,1,0x8227,0x1406,
             (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)data);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar2,0xb,2,1,1,0x8227,0x1406,data + 1);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar2,0x18,0xd,1,1,0x8227,0x1406,data + 2);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar2,9,0xe,1,1,0x8227,0x1406,data + 3);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x8072,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2700);
  return;
}

Assistant:

virtual GLvoid CreateTexture2DRg(bool base_level = false)
	{
		GLenum		internal_format = GL_RG32F;
		GLenum		format			= GL_RG;
		const GLint csize			= base_level ? 64 : 32;
		GLint		size			= csize;
		GLenum		target			= GL_TEXTURE_2D;
		GLenum		tex_type		= GL_FLOAT;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, 0);
			std::vector<Vec2> pixels(size * size, Vec2(1.0));
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, &pixels[0]);
		}

		Vec2 data[4] = { Vec2(12. / 16, 13. / 16), Vec2(8. / 16, 9. / 16), Vec2(0. / 16, 1. / 16),
						 Vec2(4. / 16, 5. / 16) };

		glTexSubImage2D(target, base_level, 22, 25, 2, 2, format, tex_type, data);
		glTexSubImage2D(target, base_level, 16, 10, 1, 1, format, tex_type, data + 0);
		glTexSubImage2D(target, base_level, 11, 2, 1, 1, format, tex_type, data + 1);
		glTexSubImage2D(target, base_level, 24, 13, 1, 1, format, tex_type, data + 2);
		glTexSubImage2D(target, base_level, 9, 14, 1, 1, format, tex_type, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (IsFloatingPointTexture(internal_format))
		{
			glTexParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
		}
	}